

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallLeafHeapBlock.cpp
# Opt level: O1

SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *
Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::New
          (HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *bucket)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  HeapAllocator *pHVar5;
  size_t sVar6;
  char *__s;
  size_t byteSize;
  uint objectCount;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (0x300 < (bucket->super_HeapBucket).sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallLeafHeapBlock.cpp"
                       ,0xd,"(bucket->sizeCat <= TBlockAttributes::MaxObjectSize)",
                       "bucket->sizeCat <= TBlockAttributes::MaxObjectSize");
    if (!bVar3) goto LAB_00749b72;
    *puVar4 = 0;
  }
  data._36_4_ = ZEXT24((ushort)(bucket->super_HeapBucket).sizeCat);
  uVar1 = (ulong)(uint)data._36_4_;
  pHVar5 = HeapAllocator::GetNoMemProtectInstance();
  objectCount = (uint)(0x1000 / uVar1);
  data.typeinfo =
       (type_info *)SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAllocPlusSize(objectCount);
  local_60 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_27e98e1;
  data.filename._0_4_ = 0x12;
  pHVar5 = HeapAllocator::TrackAllocInfo(pHVar5,(TrackAllocData *)local_60);
  sVar6 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAllocPlusSize(objectCount);
  if (sVar6 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x240,"(plusSize != 0)","plusSize != 0");
    if (!bVar3) goto LAB_00749b72;
    *puVar4 = 0;
  }
  if ((sVar6 + 7 & 0xfffffffffffffff8) != sVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x243,"(plusSize == Math::Align<size_t>(plusSize, sizeof(size_t)))",
                       "plusSize == Math::Align<size_t>(plusSize, sizeof(size_t))");
    if (!bVar3) {
LAB_00749b72:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  byteSize = 0xffffffffffffffff;
  if (sVar6 < 0xfffffffffffffef0) {
    byteSize = sVar6 + 0x110;
  }
  __s = HeapAllocator::AllocT<true>(pHVar5,byteSize);
  if (__s == (char *)0x0) {
    sVar6 = 0;
  }
  else {
    memset(__s,0,byteSize);
  }
  SmallLeafHeapBlockT((SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)(__s + sVar6),bucket,
                      data._36_2_,(ushort)(0x1000 / uVar1));
  return (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)(__s + sVar6);
}

Assistant:

SmallLeafHeapBlockT<TBlockAttributes> *
SmallLeafHeapBlockT<TBlockAttributes>::New(HeapBucketT<SmallLeafHeapBlockT<TBlockAttributes>> * bucket)
{
    CompileAssert(TBlockAttributes::MaxObjectSize <= USHRT_MAX);
    Assert(bucket->sizeCat <= TBlockAttributes::MaxObjectSize);
    Assert((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= USHRT_MAX);

    ushort objectSize = (ushort)bucket->sizeCat;
    ushort objectCount = (ushort)((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / objectSize);
    return NoMemProtectHeapNewNoThrowPlusPrefixZ(Base::GetAllocPlusSize(objectCount), SmallLeafHeapBlockT<TBlockAttributes>, bucket, objectSize, objectCount);
}